

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_6c61f2::cmDirectoryListGenerator::TransformNameBeforeCmp
          (string *__return_storage_ptr__,cmDirectoryListGenerator *this,string *same)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)same);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string TransformNameBeforeCmp(std::string same) { return same; }